

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O2

void __thiscall
burst::algorithm::
bitap<wchar_t,std::bitset<32ul>,std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>
::bitap<std::__cxx11::wstring>
          (bitap<wchar_t,std::bitset<32ul>,std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>
           *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pattern
          )

{
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_10;
  
  local_10._M_current = (pattern->_M_dataplus)._M_p;
  std::
  make_shared<burst::algorithm::detail::element_position_bitmask_table<std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>const,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
            ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)this,&local_10);
  if (*(ulong *)(*(long *)this + 0x30) < 0x21) {
    return;
  }
  __assert_fail("m_bitmask_table->length() <= bitmask_size",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/searching/bitap.hpp"
                ,0x4c,
                "burst::algorithm::bitap<wchar_t, std::bitset<32>>::bitap(const ForwardRange &) [Value = wchar_t, Bitmask = std::bitset<32>, Map = std::map<wchar_t, std::bitset<32>>, ForwardRange = std::basic_string<wchar_t>]"
               );
}

Assistant:

explicit bitap (const ForwardRange & pattern):
                m_bitmask_table
                (
                    std::make_shared<const bitmask_table_type>(pattern.begin(), pattern.end())
                )
            {
                BOOST_ASSERT(m_bitmask_table->length() <= bitmask_size);
            }